

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# file.cpp
# Opt level: O0

__ssize_t __thiscall
Common::TextFile::getline_abi_cxx11_(TextFile *this,char **__lineptr,size_t *__n,FILE *__stream)

{
  bool bVar1;
  char *pcVar2;
  FILE *__stream_00;
  size_t sVar3;
  char *__src;
  size_t step;
  charptr *str;
  iterator __end1;
  iterator __begin1;
  list<Common::charptr,_std::allocator<Common::charptr>_> *__range1;
  char *iter;
  size_t reclen;
  charptr result;
  char c;
  charptr *buffer;
  size_t length;
  size_t size;
  list<Common::charptr,_std::allocator<Common::charptr>_> strlist;
  list<Common::charptr,_std::allocator<Common::charptr>_> *in_stack_fffffffffffffea8;
  list<Common::charptr,_std::allocator<Common::charptr>_> *in_stack_fffffffffffffeb0;
  allocator *paVar4;
  value_type *in_stack_fffffffffffffeb8;
  list<Common::charptr,_std::allocator<Common::charptr>_> *in_stack_fffffffffffffec0;
  size_t local_110;
  allocator local_c1;
  size_t local_c0;
  reference local_b8;
  _Self local_b0;
  _Self local_a8;
  undefined1 *local_a0;
  char *local_98;
  size_t local_90;
  charptr local_88;
  undefined4 local_70;
  allocator local_6a;
  char local_69;
  reference local_68;
  charptr local_50;
  size_t local_38;
  undefined8 local_30;
  undefined1 local_28 [24];
  char **local_10;
  TextFile *local_8;
  
  local_10 = __lineptr;
  local_8 = this;
  std::__cxx11::list<Common::charptr,_std::allocator<Common::charptr>_>::list
            ((list<Common::charptr,_std::allocator<Common::charptr>_> *)0x1e2ca4);
  local_30 = 0x100;
  local_38 = 0;
  while( true ) {
    charptr::charptr(&local_50,0x100);
    std::__cxx11::list<Common::charptr,_std::allocator<Common::charptr>_>::push_back
              (in_stack_fffffffffffffec0,in_stack_fffffffffffffeb8);
    charptr::~charptr(&local_50);
    local_68 = std::__cxx11::list<Common::charptr,_std::allocator<Common::charptr>_>::back
                         (in_stack_fffffffffffffeb0);
    pcVar2 = charptr::get((charptr *)0x1e2d18);
    __stream_00 = (FILE *)std::__shared_ptr<_IO_FILE,_(__gnu_cxx::_Lock_policy)2>::get
                                    ((__shared_ptr<_IO_FILE,_(__gnu_cxx::_Lock_policy)2> *)__lineptr
                                    );
    fgets(pcVar2,0x101,__stream_00);
    pcVar2 = charptr::operator[](local_68,0xff);
    local_69 = *pcVar2;
    if ((local_69 == '\0') || (local_69 == '\n')) break;
    local_38 = local_38 + 0x100;
  }
  sVar3 = charptr::length(local_68);
  local_38 = sVar3 + local_38;
  if (local_38 == 0) {
    std::allocator<char>::allocator();
    std::__cxx11::string::string((string *)this,"",&local_6a);
    std::allocator<char>::~allocator((allocator<char> *)&local_6a);
    local_70 = 1;
  }
  else {
    charptr::charptr(&local_88,local_38);
    local_90 = local_38;
    local_98 = charptr::get((charptr *)0x1e2eb2);
    local_a0 = local_28;
    local_a8._M_node =
         (_List_node_base *)
         std::__cxx11::list<Common::charptr,_std::allocator<Common::charptr>_>::begin
                   (in_stack_fffffffffffffea8);
    local_b0._M_node =
         (_List_node_base *)
         std::__cxx11::list<Common::charptr,_std::allocator<Common::charptr>_>::end
                   (in_stack_fffffffffffffea8);
    while( true ) {
      bVar1 = std::operator!=(&local_a8,&local_b0);
      if (!bVar1) break;
      local_b8 = std::_List_iterator<Common::charptr>::operator*
                           ((_List_iterator<Common::charptr> *)0x1e2f2b);
      pcVar2 = local_98;
      if (local_90 < 0x100) {
        local_110 = local_90;
      }
      else {
        local_110 = 0x100;
      }
      local_c0 = local_110;
      __src = charptr::get((charptr *)0x1e2f83);
      memcpy(pcVar2,__src,local_c0);
      local_98 = local_98 + local_c0;
      local_90 = local_90 - local_c0;
      std::_List_iterator<Common::charptr>::operator++(&local_a8);
    }
    pcVar2 = charptr::operator[](&local_88,local_38 - 1);
    if (*pcVar2 == '\n') {
      pcVar2 = charptr::operator[](&local_88,local_38 - 1);
      *pcVar2 = '\0';
    }
    if (1 < local_38) {
      pcVar2 = charptr::operator[](&local_88,local_38 - 2);
      if (*pcVar2 == '\r') {
        pcVar2 = charptr::operator[](&local_88,local_38 - 2);
        *pcVar2 = '\0';
      }
    }
    pcVar2 = charptr::get((charptr *)0x1e30bf);
    paVar4 = &local_c1;
    std::allocator<char>::allocator();
    std::__cxx11::string::string((string *)this,pcVar2,paVar4);
    std::allocator<char>::~allocator((allocator<char> *)&local_c1);
    local_70 = 1;
    charptr::~charptr(&local_88);
  }
  std::__cxx11::list<Common::charptr,_std::allocator<Common::charptr>_>::~list
            ((list<Common::charptr,_std::allocator<Common::charptr>_> *)0x1e3152);
  return (__ssize_t)this;
}

Assistant:

std::string TextFile::getline() {
	std::list<charptr> strlist;
	const size_t size = 0x100;
	size_t length = 0;

	while (true) {
		strlist.push_back(charptr(size));
		charptr &buffer = strlist.back();

		fgets(buffer.get(), size + 1, _file.get());

		// Line:
		//  Linux:   \n
		//  Windows: \r\n

		char c = buffer[size - 1];
		if (c == '\0' || c == '\n') {
			length += buffer.length();
			break;
		}
		else {
			length += size;
		}
	}

	if (length == 0)
		return "";

	charptr result(length); // The std::string end without '\0'
	size_t reclen = length;

	auto iter = result.get();

	for (auto &str : strlist) {
		size_t step = reclen < size ? reclen : size;
		std::memcpy(iter, str.get(), step);
		iter += step;
		reclen -= step;
	}

	// Remove \n, \r
	if (result[length - 1] == '\n')
		result[length - 1] = '\0';
	if (length >= 2 && result[length - 2] == '\r')
		result[length - 2] = '\0';

	return result.get(); // Remove '\0
}